

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O3

int vardata_validate(vardata *data)

{
  vardata_mode *pvVar1;
  int *piVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  void *pvVar6;
  vardata_feature *pvVar7;
  vardata_variant *pvVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint32_t **ppuVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong __size;
  long lVar18;
  
  if (data->validated != 0) {
    abort();
  }
  data->validated = 1;
  uVar11 = data->featuresnum;
  uVar17 = (ulong)uVar11;
  if (0 < (int)uVar11) {
    __size = uVar17 + 0x1f >> 5;
    ppuVar13 = &data->features->cfmask;
    uVar15 = 0;
    do {
      puVar4 = (uint32_t *)calloc(4,__size);
      ppuVar13[-1] = puVar4;
      puVar5 = (uint32_t *)calloc(4,__size);
      *ppuVar13 = puVar5;
      puVar4[uVar15 >> 5 & 0x7ffffff] = 1 << ((byte)uVar15 & 0x1f);
      uVar15 = uVar15 + 1;
      ppuVar13 = ppuVar13 + 8;
    } while (uVar17 != uVar15);
  }
  iVar12 = data->variantsnum;
  if (0 < (long)iVar12) {
    iVar9 = uVar11 + 0x3e;
    if (-1 < (int)(uVar11 + 0x1f)) {
      iVar9 = uVar11 + 0x1f;
    }
    pvVar8 = data->variants;
    lVar16 = 0;
    do {
      pvVar6 = calloc(4,(long)(iVar9 >> 5));
      *(void **)((long)&pvVar8->fmask + lVar16) = pvVar6;
      lVar16 = lVar16 + 0x30;
    } while ((long)iVar12 * 0x30 != lVar16);
  }
  iVar12 = data->modesnum;
  if (0 < (long)iVar12) {
    iVar9 = uVar11 + 0x3e;
    if (-1 < (int)(uVar11 + 0x1f)) {
      iVar9 = uVar11 + 0x1f;
    }
    pvVar1 = data->modes;
    lVar16 = 0;
    do {
      pvVar6 = calloc(4,(long)(iVar9 >> 5));
      *(void **)((long)&pvVar1->rfmask + lVar16) = pvVar6;
      lVar16 = lVar16 + 0x30;
    } while ((long)iVar12 * 0x30 != lVar16);
  }
  if (0 < (int)uVar11) {
    pvVar7 = data->features;
    uVar15 = 0;
    do {
      if (0 < pvVar7[uVar15].impliesnum) {
        lVar16 = 0;
        do {
          if (0 < (int)uVar17) {
            iVar12 = pvVar7[uVar15].implies[lVar16];
            lVar18 = 0x10;
            lVar10 = 0;
            do {
              puVar4 = *(uint32_t **)((long)&data->features->name + lVar18);
              if ((puVar4[uVar15 >> 5 & 0x7ffffff] & 1 << ((byte)uVar15 & 0x1f)) != 0) {
                mask_or(puVar4,data->features[iVar12].ifmask,(int)uVar17);
                uVar17 = (ulong)(uint)data->featuresnum;
              }
              lVar10 = lVar10 + 1;
              lVar18 = lVar18 + 0x40;
            } while (lVar10 < (int)uVar17);
            pvVar7 = data->features;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < pvVar7[uVar15].impliesnum);
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)(int)uVar17);
    if (0 < (int)uVar17) {
      pvVar7 = data->features;
      uVar15 = 0;
      do {
        if (0 < pvVar7[uVar15].conflictsnum) {
          puVar4 = pvVar7[uVar15].cfmask;
          piVar2 = pvVar7[uVar15].conflicts;
          lVar16 = 0;
          do {
            iVar12 = piVar2[lVar16];
            iVar9 = iVar12 + 0x1f;
            if (-1 < iVar12) {
              iVar9 = iVar12;
            }
            puVar4[iVar9 >> 5] = puVar4[iVar9 >> 5] | 1 << ((byte)iVar12 & 0x1f);
            pvVar7[iVar12].cfmask[uVar15 >> 5 & 0x7ffffff] =
                 pvVar7[iVar12].cfmask[uVar15 >> 5 & 0x7ffffff] | 1 << ((byte)uVar15 & 0x1f);
            lVar16 = lVar16 + 1;
          } while (lVar16 < pvVar7[uVar15].conflictsnum);
          uVar17 = (ulong)(uint)data->featuresnum;
        }
        uVar15 = uVar15 + 1;
      } while ((long)uVar15 < (long)(int)uVar17);
    }
  }
  do {
    if ((int)uVar17 < 1) break;
    lVar16 = 0;
    uVar11 = 0;
    do {
      if (0 < (int)uVar17) {
        lVar10 = 0x18;
        uVar15 = 0;
        do {
          pvVar7 = data->features;
          if ((pvVar7[lVar16].ifmask[uVar15 >> 5 & 0x7ffffff] >> ((uint)uVar15 & 0x1f) & 1) != 0) {
            uVar3 = mask_or_r(pvVar7[lVar16].cfmask,*(uint32_t **)((long)&pvVar7->name + lVar10),
                              (int)uVar17);
            uVar11 = uVar11 | uVar3;
            uVar17 = (ulong)(uint)data->featuresnum;
          }
          uVar15 = uVar15 + 1;
          lVar10 = lVar10 + 0x40;
        } while ((long)uVar15 < (long)(int)uVar17);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (int)uVar17);
  } while (uVar11 != 0);
  if ((int)uVar17 < 1) {
    iVar12 = 0;
  }
  else {
    lVar16 = 0;
    uVar15 = 0;
    iVar12 = 0;
    do {
      if ((*(uint *)(*(long *)((long)&data->features->cfmask + lVar16) +
                    (uVar15 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar15 & 0x1f) & 1) != 0) {
        fprintf(_stderr,"vardata %s: feature %s conflicts with itself!\n",data->name,
                *(undefined8 *)((long)&data->features->name + lVar16));
        uVar17 = (ulong)(uint)data->featuresnum;
        iVar12 = 1;
      }
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x40;
    } while ((long)uVar15 < (long)(int)uVar17);
  }
  iVar9 = data->variantsnum;
  if (0 < iVar9) {
    pvVar8 = data->variants;
    lVar16 = 0;
    do {
      if (0 < pvVar8[lVar16].featuresnum) {
        lVar10 = 0;
        do {
          mask_or(pvVar8[lVar16].fmask,data->features[pvVar8[lVar16].features[lVar10]].ifmask,
                  data->featuresnum);
          lVar10 = lVar10 + 1;
          pvVar8 = data->variants;
        } while (lVar10 < pvVar8[lVar16].featuresnum);
        iVar9 = data->variantsnum;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar9);
  }
  iVar9 = data->modesnum;
  if (0 < iVar9) {
    pvVar1 = data->modes;
    lVar16 = 0;
    do {
      if (0 < pvVar1[lVar16].rfeaturesnum) {
        puVar4 = pvVar1[lVar16].rfmask;
        piVar2 = pvVar1[lVar16].rfeatures;
        lVar10 = 0;
        do {
          iVar9 = piVar2[lVar10];
          iVar14 = iVar9 + 0x1f;
          if (-1 < iVar9) {
            iVar14 = iVar9;
          }
          puVar4[iVar14 >> 5] = puVar4[iVar14 >> 5] | 1 << ((byte)iVar9 & 0x1f);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pvVar1[lVar16].rfeaturesnum);
        iVar9 = data->modesnum;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar9);
  }
  return iVar12;
}

Assistant:

int vardata_validate(struct vardata *data) {
	int res = 0;
	if (data->validated)
		abort();
	data->validated = 1;
	int i, j;
	for (i = 0; i < data->featuresnum; i++) {
		data->features[i].ifmask = mask_new(data->featuresnum);
		data->features[i].cfmask = mask_new(data->featuresnum);
		mask_set(data->features[i].ifmask, i);
	}
	for (i = 0; i < data->variantsnum; i++) {
		data->variants[i].fmask = mask_new(data->featuresnum);
	}
	for (i = 0; i < data->modesnum; i++) {
		data->modes[i].rfmask = mask_new(data->featuresnum);
	}
	/* implies */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].impliesnum; j++) {
			int k = data->features[i].implies[j];
			int l;
			for (l = 0; l < data->featuresnum; l++) {
				if (mask_get(data->features[l].ifmask, i)) {
					mask_or(data->features[l].ifmask, data->features[k].ifmask, data->featuresnum);
				}
			}
		}
	}
	/* conflicts */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].conflictsnum; j++) {
			int k = data->features[i].conflicts[j];
			mask_set(data->features[i].cfmask, k);
			mask_set(data->features[k].cfmask, i);
		}
	}
	int p = 1;
	while (p) {
		p = 0;
		for (i = 0; i < data->featuresnum; i++) {
			for (j = 0; j < data->featuresnum; j++) {
				if (mask_get(data->features[i].ifmask, j)) {
					p |= mask_or_r(data->features[i].cfmask, data->features[j].cfmask, data->featuresnum);
				}
			}
		}
	}
	for (i = 0; i < data->featuresnum; i++) {
		if (mask_get(data->features[i].cfmask, i)) {
			fprintf(stderr, "vardata %s: feature %s conflicts with itself!\n", data->name, data->features[i].name);
			res = 1;
		}
	}
	/* variants */
	for (i = 0; i < data->variantsnum; i++) {
		for (j = 0; j < data->variants[i].featuresnum; j++) {
			int k = data->variants[i].features[j];
			mask_or(data->variants[i].fmask, data->features[k].ifmask, data->featuresnum);
		}
	}
	/* variants */
	for (i = 0; i < data->modesnum; i++) {
		for (j = 0; j < data->modes[i].rfeaturesnum; j++) {
			int k = data->modes[i].rfeatures[j];
			mask_set(data->modes[i].rfmask, k);
		}
	}
	return res;
}